

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_row_access_constructors<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>
                *matrix,vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>_>_>
                        *rows)

{
  uint uVar1;
  pointer pIVar2;
  undefined8 *puVar3;
  pointer psVar4;
  node_ptr plVar5;
  node_ptr plVar6;
  type *ptVar7;
  Column_dimension_option CVar8;
  Field_operators *pFVar9;
  bool bVar10;
  node_ptr to_erase;
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
  *__v;
  long lVar11;
  const_node_ptr p;
  Column_support *pCVar12;
  node_ptr plVar13;
  Column_support *pCVar14;
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>
  *r;
  node_ptr plVar15;
  pointer psVar16;
  undefined4 local_294;
  undefined *local_290;
  undefined4 *local_288;
  undefined **local_280;
  undefined **local_278;
  char *local_270;
  shared_count sStack_268;
  char *local_260;
  undefined **local_258;
  ulong local_250;
  shared_count sStack_248;
  undefined4 **local_240;
  Delete_disposer local_238;
  undefined1 local_230;
  undefined8 *local_228;
  undefined ***local_220;
  char *local_218;
  char *local_210;
  shared_count sStack_208;
  undefined1 local_200 [24];
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
  local_1e8;
  undefined1 local_1b0 [24];
  Field_operators *local_198;
  Entry_constructor *pEStack_190;
  list_node<void_*> local_188;
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>
  *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_200._16_8_ = rows;
  build_rows<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_1b0,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)(local_200 + 0x18),
             (vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_1b0);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_1b0);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)(local_200 + 0x18));
  build_column_values<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_1b0,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)(local_200 + 0x18),
             (vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_1b0);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_1b0);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)(local_200 + 0x18));
  pIVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1e8.super_Row_access_option.columnIndex_ = 6;
  local_1e8.super_Column_dimension_option.dim_ = (pIVar2->super_Column_dimension_option).dim_;
  local_1e8.operators_ = pIVar2->operators_;
  local_1e8.entryPool_ = pIVar2->entryPool_;
  pCVar14 = &local_1e8.column_;
  local_1e8.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)pCVar14;
  local_1e8.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)pCVar14;
  local_178 = matrix;
  local_1e8.super_Row_access_option.rows_ = (Row_container *)local_200._16_8_;
  for (puVar3 = *(undefined8 **)&(pIVar2->column_).super_type.data_.root_plus_size_;
      (Column_support *)puVar3 != &pIVar2->column_; puVar3 = (undefined8 *)*puVar3) {
    uVar1 = *(uint *)(puVar3 + 2);
    __v = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
           *)operator_new(0x20);
    (__v->super_Entry_column_index_option).columnIndex_ =
         local_1e8.super_Row_access_option.columnIndex_;
    __v->rowIndex_ = uVar1;
    (__v->super_Entry_field_element_option).element_ = *(uint *)((long)puVar3 + -4);
    (__v->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
         local_1e8.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
    (__v->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)pCVar14
    ;
    ptVar7 = (type *)&(local_1e8.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_)
                      ->next_;
    local_1e8.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
         (node_ptr)&__v->super_Column_hook;
    (ptVar7->super_type).super_list_node<void_*>.next_ = (node_ptr)&__v->super_Column_hook;
    if ((pointer)local_1e8.super_Row_access_option.rows_ != (pointer)0x0) {
      lVar11 = *(long *)&((_Rep_type *)
                         &(local_1e8.super_Row_access_option.rows_)->
                          super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>_>_>
                         )->_M_impl;
      if ((ulong)(((long)*(pointer *)
                          &(((_Rep_type *)
                            &(local_1e8.super_Row_access_option.rows_)->
                             super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>_>_>
                            )->_M_impl).super__Rb_tree_header._M_header - lVar11 >> 4) *
                 -0x5555555555555555) < (ulong)(uVar1 + 1)) {
        std::
        vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>_>_>
        ::resize(local_1e8.super_Row_access_option.rows_,(ulong)(uVar1 + 1));
        lVar11 = *(long *)&((_Rep_type *)
                           &(local_1e8.super_Row_access_option.rows_)->
                            super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>_>_>
                           )->_M_impl;
      }
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>>
      ::
      _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>const&>
                ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>>
                  *)((ulong)uVar1 * 0x30 + lVar11),__v);
    }
  }
  psVar4 = *(pointer *)&(((pointer)local_200._16_8_)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  uVar1 = local_1e8.super_Row_access_option.columnIndex_;
  CVar8.dim_ = local_1e8.super_Column_dimension_option.dim_;
  pFVar9 = local_1e8.operators_;
  pEStack_190 = local_1e8.entryPool_;
  for (psVar16 = *(pointer *)&(((pointer)local_200._16_8_)->_M_t)._M_impl; psVar16 != psVar4;
      psVar16 = psVar16 + 1) {
    local_1e8.super_Row_access_option.columnIndex_ = uVar1;
    local_1e8.super_Column_dimension_option.dim_ = CVar8.dim_;
    local_1e8.operators_ = pFVar9;
    local_1e8.entryPool_ = pEStack_190;
    if ((psVar16->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
      lVar11 = std::_Rb_tree_decrement(&(psVar16->_M_t)._M_impl.super__Rb_tree_header._M_header);
      if ((*(uint *)(lVar11 + 0x38) < 6) && ((0x2bU >> (*(uint *)(lVar11 + 0x38) & 0x1f) & 1) != 0))
      {
        local_120 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_118 = "";
        local_130 = &boost::unit_test::basic_cstring<char_const>::null;
        local_128 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x215);
        local_250 = local_250 & 0xffffffffffffff00;
        local_258 = &PTR__lazy_ostream_00248430;
        sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_240 = (undefined4 **)0x201316;
        local_288 = (undefined4 *)CONCAT44(local_288._4_4_,*(int *)(lVar11 + 0x20));
        local_290 = (undefined *)CONCAT44(local_290._4_4_,6);
        local_278 = (undefined **)CONCAT71(local_278._1_7_,*(int *)(lVar11 + 0x20) == 6);
        local_270 = (char *)0x0;
        sStack_268.pi_ = (sp_counted_base *)0x0;
        local_218 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_210 = "";
        local_200._0_8_ = &local_288;
        local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
        local_1b0._0_8_ = &PTR__lazy_ostream_00248930;
        local_1b0._16_8_ = &boost::unit_test::lazy_ostream::inst;
        local_198 = (Field_operators *)local_200;
        local_280 = &local_290;
        local_230 = 0;
        local_238.col_ =
             (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
              *)&PTR__lazy_ostream_002486b0;
        local_228 = &boost::unit_test::lazy_ostream::inst;
        local_220 = &local_280;
        boost::test_tools::tt_detail::report_assertion
                  (&local_278,&local_258,&local_218,0x215,1,2,2,"entry.get_column_index()",local_1b0
                   ,"6",&local_238);
        boost::detail::shared_count::~shared_count(&sStack_268);
      }
    }
    uVar1 = local_1e8.super_Row_access_option.columnIndex_;
    CVar8.dim_ = local_1e8.super_Column_dimension_option.dim_;
    pFVar9 = local_1e8.operators_;
    pEStack_190 = local_1e8.entryPool_;
  }
  local_1e8.super_Row_access_option.columnIndex_ = 0;
  local_1b0._4_4_ = (undefined4)((ulong)local_1b0._0_8_ >> 0x20);
  local_1b0._0_4_ = uVar1;
  local_1e8.super_Column_dimension_option.dim_ = -1;
  local_1b0._20_4_ = (undefined4)((ulong)local_1b0._16_8_ >> 0x20);
  local_1b0._16_4_ = CVar8.dim_;
  local_1e8.operators_ = (Field_operators *)0x0;
  local_1e8.entryPool_ = (Entry_constructor *)0x0;
  pCVar14 = &local_1e8.column_;
  local_1b0._8_8_ = local_1e8.super_Row_access_option.rows_;
  local_198 = pFVar9;
  local_188.next_ = &local_188;
  local_188.prev_ = &local_188;
  boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
  swap_nodes(&local_188,(node_ptr)pCVar14);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_270 = (char *)((ulong)local_270 & 0xffffffffffffff00);
  local_278 = &PTR__lazy_ostream_00248430;
  sStack_268.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_260 = "";
  local_290 = (undefined *)0xffffffffffffffff;
  plVar13 = &local_188;
  do {
    plVar13 = plVar13->next_;
    local_290 = local_290 + 1;
  } while (plVar13 != &local_188);
  local_280 = &local_290;
  local_288 = &local_294;
  local_294 = 4;
  local_210 = (char *)0x0;
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_200._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_200._8_8_ = "";
  local_220 = &local_280;
  local_230 = 0;
  local_238.col_ =
       (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
        *)&PTR__lazy_ostream_002483f0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_240 = &local_288;
  local_250 = local_250 & 0xffffffffffffff00;
  local_258 = &PTR__lazy_ostream_002486b0;
  sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_218._0_1_ = local_290 == (undefined *)0x4;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,&local_278,local_200,0x21c,1,2,2,"moveCol.size()",&local_238,"4",&local_258)
  ;
  boost::detail::shared_count::~shared_count(&sStack_208);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_270 = (char *)((ulong)local_270 & 0xffffffffffffff00);
  local_278 = &PTR__lazy_ostream_00248430;
  sStack_268.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_260 = "";
  lVar11 = 1;
  pCVar12 = pCVar14;
  do {
    pCVar12 = *(Column_support **)&(pCVar12->super_type).data_;
    lVar11 = lVar11 + -1;
  } while (pCVar12 != pCVar14);
  local_290 = (undefined *)-lVar11;
  local_294 = 0;
  local_218 = (char *)CONCAT71(local_218._1_7_,lVar11 == 0);
  local_210 = (char *)0x0;
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_200._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_200._8_8_ = "";
  local_280 = &local_290;
  local_230 = 0;
  local_238.col_ =
       (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
        *)&PTR__lazy_ostream_002483f0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &local_280;
  local_288 = &local_294;
  local_250 = local_250 & 0xffffffffffffff00;
  local_258 = &PTR__lazy_ostream_002486b0;
  sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_240 = &local_288;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,&local_278,local_200,0x21d,1,2,2,"col.size()",&local_238,"0",&local_258);
  boost::detail::shared_count::~shared_count(&sStack_208);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar10 = Gudhi::persistence_matrix::operator==
                     ((local_178->
                      super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
                       *)local_1b0);
  local_258 = (undefined **)CONCAT71(local_258._1_7_,bVar10);
  local_250 = 0;
  sStack_248.pi_ = (sp_counted_base *)0x0;
  local_278 = (undefined **)0x20bfcd;
  local_270 = "";
  local_230 = 0;
  local_238.col_ =
       (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
        *)&PTR__lazy_ostream_002483a0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_220 = &local_278;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_248);
  psVar4 = *(pointer *)&(((_Rep_type *)local_200._16_8_)->_M_impl).super__Rb_tree_header._M_header;
  for (psVar16 = *(pointer *)&((_Rep_type *)local_200._16_8_)->_M_impl; psVar16 != psVar4;
      psVar16 = psVar16 + 1) {
    if ((psVar16->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
      lVar11 = std::_Rb_tree_decrement(&(psVar16->_M_t)._M_impl.super__Rb_tree_header._M_header);
      if ((*(uint *)(lVar11 + 0x38) < 6) && ((0x2bU >> (*(uint *)(lVar11 + 0x38) & 0x1f) & 1) != 0))
      {
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_138 = "";
        local_150 = &boost::unit_test::basic_cstring<char_const>::null;
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x22d,
                   &local_150);
        local_270 = (char *)((ulong)local_270 & 0xffffffffffffff00);
        local_278 = &PTR__lazy_ostream_00248430;
        sStack_268.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_260 = "";
        local_290 = (undefined *)CONCAT44(local_290._4_4_,*(int *)(lVar11 + 0x20));
        local_294 = 6;
        local_218 = (char *)CONCAT71(local_218._1_7_,*(int *)(lVar11 + 0x20) == 6);
        local_210 = (char *)0x0;
        sStack_208.pi_ = (sp_counted_base *)0x0;
        local_200._0_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_200._8_8_ = "";
        local_280 = &local_290;
        local_230 = 0;
        local_238.col_ =
             (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
              *)&PTR__lazy_ostream_00248930;
        local_228 = &boost::unit_test::lazy_ostream::inst;
        local_220 = &local_280;
        local_288 = &local_294;
        local_250 = local_250 & 0xffffffffffffff00;
        local_258 = &PTR__lazy_ostream_002486b0;
        sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_240 = &local_288;
        boost::test_tools::tt_detail::report_assertion
                  (&local_218,&local_278,local_200,0x22d,1,2,2,"entry.get_column_index()",&local_238
                   ,"6",&local_258);
        boost::detail::shared_count::~shared_count(&sStack_208);
      }
    }
  }
  Gudhi::persistence_matrix::swap
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
              *)(local_200 + 0x18),
             (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
              *)local_1b0);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_270 = (char *)((ulong)local_270 & 0xffffffffffffff00);
  local_278 = &PTR__lazy_ostream_00248430;
  sStack_268.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_260 = "";
  lVar11 = 1;
  plVar13 = &local_188;
  do {
    plVar13 = plVar13->next_;
    lVar11 = lVar11 + -1;
  } while (plVar13 != &local_188);
  local_290 = (undefined *)-lVar11;
  local_294 = 0;
  local_210 = (char *)0x0;
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_200._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_200._8_8_ = "";
  local_280 = &local_290;
  local_230 = 0;
  local_238.col_ =
       (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
        *)&PTR__lazy_ostream_002483f0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &local_280;
  local_288 = &local_294;
  local_250 = local_250 & 0xffffffffffffff00;
  local_258 = &PTR__lazy_ostream_002486b0;
  sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_240 = &local_288;
  local_218._0_1_ = lVar11 == 0;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,&local_278,local_200,0x234,1,2,2,"moveCol.size()",&local_238,"0",&local_258)
  ;
  boost::detail::shared_count::~shared_count(&sStack_208);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_270 = (char *)((ulong)local_270 & 0xffffffffffffff00);
  local_278 = &PTR__lazy_ostream_00248430;
  sStack_268.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_260 = "";
  local_290 = (undefined *)0xffffffffffffffff;
  pCVar14 = &local_1e8.column_;
  do {
    pCVar14 = *(Column_support **)&(pCVar14->super_type).data_.root_plus_size_;
    local_290 = local_290 + 1;
  } while (pCVar14 != &local_1e8.column_);
  local_294 = 4;
  local_218 = (char *)CONCAT71(local_218._1_7_,local_290 == (undefined *)0x4);
  local_210 = (char *)0x0;
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_200._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_200._8_8_ = "";
  local_280 = &local_290;
  local_230 = 0;
  local_238.col_ =
       (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
        *)&PTR__lazy_ostream_002483f0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = &local_280;
  local_288 = &local_294;
  local_250 = local_250 & 0xffffffffffffff00;
  local_258 = &PTR__lazy_ostream_002486b0;
  sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_240 = &local_288;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,&local_278,local_200,0x235,1,2,2,"col.size()",&local_238,"4",&local_258);
  boost::detail::shared_count::~shared_count(&sStack_208);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar10 = Gudhi::persistence_matrix::operator==
                     ((local_178->
                      super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
                       *)(local_200 + 0x18));
  local_258 = (undefined **)CONCAT71(local_258._1_7_,bVar10);
  local_250 = 0;
  sStack_248.pi_ = (sp_counted_base *)0x0;
  local_278 = (undefined **)0x20bfe2;
  local_270 = "";
  local_230 = 0;
  local_238.col_ =
       (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
        *)&PTR__lazy_ostream_002483a0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_220 = &local_278;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_248);
  psVar4 = *(pointer *)&(((_Rep_type *)local_200._16_8_)->_M_impl).super__Rb_tree_header._M_header;
  for (psVar16 = *(pointer *)&((_Rep_type *)local_200._16_8_)->_M_impl; psVar16 != psVar4;
      psVar16 = psVar16 + 1) {
    if ((psVar16->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
      lVar11 = std::_Rb_tree_decrement(&(psVar16->_M_t)._M_impl.super__Rb_tree_header._M_header);
      if ((*(uint *)(lVar11 + 0x38) < 6) && ((0x2bU >> (*(uint *)(lVar11 + 0x38) & 0x1f) & 1) != 0))
      {
        local_160 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_158 = "";
        local_170 = &boost::unit_test::basic_cstring<char_const>::null;
        local_168 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x245,
                   &local_170);
        local_270 = (char *)((ulong)local_270 & 0xffffffffffffff00);
        local_278 = &PTR__lazy_ostream_00248430;
        sStack_268.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_260 = "";
        local_290 = (undefined *)CONCAT44(local_290._4_4_,*(int *)(lVar11 + 0x20));
        local_294 = 6;
        local_218 = (char *)CONCAT71(local_218._1_7_,*(int *)(lVar11 + 0x20) == 6);
        local_210 = (char *)0x0;
        sStack_208.pi_ = (sp_counted_base *)0x0;
        local_200._0_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_200._8_8_ = "";
        local_280 = &local_290;
        local_230 = 0;
        local_238.col_ =
             (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
              *)&PTR__lazy_ostream_00248930;
        local_228 = &boost::unit_test::lazy_ostream::inst;
        local_220 = &local_280;
        local_288 = &local_294;
        local_250 = local_250 & 0xffffffffffffff00;
        local_258 = &PTR__lazy_ostream_002486b0;
        sStack_248.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_240 = &local_288;
        boost::test_tools::tt_detail::report_assertion
                  (&local_218,&local_278,local_200,0x245,1,2,2,"entry.get_column_index()",&local_238
                   ,"6",&local_258);
        boost::detail::shared_count::~shared_count(&sStack_208);
      }
    }
  }
  local_238.col_ =
       (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
        *)local_1b0;
  if (local_188.next_ != &local_188) {
    plVar15 = local_188.next_;
    do {
      plVar5 = plVar15->next_;
      plVar15->next_ = (node_ptr)0x0;
      plVar15->prev_ = (node_ptr)0x0;
      Gudhi::persistence_matrix::
      Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
      ::Delete_disposer::operator()(&local_238,(Entry *)&plVar15[-1].prev_);
      plVar15 = plVar5;
    } while (plVar5 != &local_188);
  }
  local_1b0._0_8_ = local_200 + 0x18;
  if (local_1e8.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ !=
      (node_ptr)&local_1e8.column_) {
    plVar13 = local_1e8.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
    do {
      plVar6 = *(node_ptr *)&(((type *)&plVar13->next_)->data_).root_plus_size_.m_header;
      *(undefined8 *)&(((type *)&plVar13->next_)->data_).root_plus_size_.m_header = 0;
      plVar13->prev_ = (node_ptr)0x0;
      Gudhi::persistence_matrix::
      Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
      ::Delete_disposer::operator()((Delete_disposer *)local_1b0,(Entry *)&plVar13[-1].prev_);
      plVar13 = plVar6;
    } while (plVar6 != (node_ptr)&local_1e8.column_);
  }
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}